

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

int Gia_Rsb2ManLevel(Gia_Rsb2Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  (p->vLevels).nSize = 0;
  Vec_IntGrow(&p->vLevels,p->nObjs);
  piVar1 = (p->vLevels).pArray;
  lVar6 = (long)p->nPis;
  while( true ) {
    lVar6 = lVar6 + 1;
    lVar5 = (long)p->iFirstPo;
    if (lVar5 <= lVar6) break;
    iVar2 = piVar1[lVar6 * 2 + 1] / 2;
    if (piVar1[lVar6 * 2 + 1] / 2 < piVar1[lVar6 * 2] / 2) {
      iVar2 = piVar1[lVar6 * 2] / 2;
    }
    piVar1[lVar6] = iVar2 + 1;
  }
  uVar4 = 0;
  for (; lVar5 < p->nObjs; lVar5 = lVar5 + 1) {
    iVar2 = piVar1[lVar5 * 2];
    iVar3 = (int)((long)iVar2 / 2);
    piVar1[lVar5] = iVar3;
    if ((int)uVar4 <= iVar3) {
      uVar4 = (long)iVar2 / 2 & 0xffffffff;
    }
  }
  return (int)uVar4;
}

Assistant:

int Gia_Rsb2ManLevel( Gia_Rsb2Man_t * p )
{
    int i, * pLevs, Level = 0;
    Vec_IntClear( &p->vLevels );
    Vec_IntGrow( &p->vLevels, p->nObjs );
    pLevs = Vec_IntArray( &p->vLevels );
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        pLevs[i] = 1 + Abc_MaxInt( pLevs[2*i+0]/2, pLevs[2*i+1]/2 );
    for ( i = p->iFirstPo; i < p->nObjs; i++ )
        Level = Abc_MaxInt( Level, pLevs[i] = pLevs[2*i+0]/2 );
    return Level;
}